

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_io.cc
# Opt level: O0

StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *
draco::ReadMeshFromFile
          (string *file_name,Options *options,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *mesh_files)

{
  bool bVar1;
  allocator<char> *paVar2;
  long in_RCX;
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *in_RDI;
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> statusor;
  Decoder decoder;
  DecoderBuffer buffer;
  vector<char,_std::allocator<char>_> file_data;
  StlDecoder stl_decoder;
  Status _local_status;
  PlyDecoder ply_decoder;
  Status obj_status;
  ObjDecoder obj_decoder;
  string extension;
  unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> mesh;
  undefined4 in_stack_fffffffffffffb28;
  Code in_stack_fffffffffffffb2c;
  ObjDecoder *in_stack_fffffffffffffb30;
  Mesh *in_stack_fffffffffffffb38;
  Mesh *in_stack_fffffffffffffb40;
  undefined7 in_stack_fffffffffffffb48;
  undefined1 in_stack_fffffffffffffb4f;
  ObjDecoder *in_stack_fffffffffffffb60;
  char *in_stack_fffffffffffffb68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined6 in_stack_fffffffffffffb88;
  undefined1 in_stack_fffffffffffffb8e;
  undefined1 in_stack_fffffffffffffb8f;
  DecoderBuffer *in_stack_fffffffffffffba0;
  Decoder *in_stack_fffffffffffffba8;
  allocator<char> local_411;
  string local_410 [32];
  string *in_stack_fffffffffffffc10;
  StlDecoder *in_stack_fffffffffffffc18;
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> local_3c8 [4];
  allocator<char> local_2f9;
  string local_2f8 [72];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  Status local_290 [2];
  uint local_21c;
  Status local_218;
  allocator<char> local_1e9;
  string local_1e8 [39];
  allocator<char> local_1c1;
  string local_1c0 [32];
  ObjDecoder local_1a0;
  string local_58 [56];
  long local_20;
  
  local_20 = in_RCX;
  operator_new(0xd8);
  Mesh::Mesh(in_stack_fffffffffffffb40);
  std::unique_ptr<draco::Mesh,std::default_delete<draco::Mesh>>::
  unique_ptr<std::default_delete<draco::Mesh>,void>
            ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)in_stack_fffffffffffffb30
             ,(pointer)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
  LowercaseFileExtension
            ((string *)
             CONCAT17(in_stack_fffffffffffffb8f,
                      CONCAT16(in_stack_fffffffffffffb8e,in_stack_fffffffffffffb88)));
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffb30,
                          (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
  if (((bVar1) &&
      (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffb30,
                               (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)
                              ), bVar1)) && (local_20 != 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffb40,(value_type *)in_stack_fffffffffffffb38);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffb30,
                          (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
  if (bVar1) {
    ObjDecoder::ObjDecoder(in_stack_fffffffffffffb60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
               (allocator<char> *)in_stack_fffffffffffffb60);
    bVar1 = Options::GetBool((Options *)in_stack_fffffffffffffb38,
                             (string *)in_stack_fffffffffffffb30,
                             SUB41((uint)in_stack_fffffffffffffb2c >> 0x18,0));
    ObjDecoder::set_use_metadata(&local_1a0,bVar1);
    std::__cxx11::string::~string(local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
               (allocator<char> *)in_stack_fffffffffffffb60);
    bVar1 = Options::GetBool((Options *)in_stack_fffffffffffffb30,
                             (string *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)
                            );
    ObjDecoder::set_preserve_polygons(&local_1a0,bVar1);
    std::__cxx11::string::~string(local_1e8);
    std::allocator<char>::~allocator(&local_1e9);
    std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::get
              ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
               in_stack_fffffffffffffb30);
    ObjDecoder::DecodeFromFile
              ((ObjDecoder *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
               (string *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffb30);
    bVar1 = Status::ok(&local_218);
    if (bVar1) {
      StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
                ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
                 in_stack_fffffffffffffb30,
                 (unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
                 CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    }
    else {
      StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
                ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
                 in_stack_fffffffffffffb30,
                 (Status *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    }
    local_21c = 1;
    Status::~Status((Status *)0x1183c0);
    ObjDecoder::~ObjDecoder(in_stack_fffffffffffffb30);
    goto LAB_0011898a;
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffb30,
                          (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
  if (bVar1) {
    PlyDecoder::PlyDecoder((PlyDecoder *)in_stack_fffffffffffffb30);
    std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::get
              ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
               in_stack_fffffffffffffb30);
    PlyDecoder::DecodeFromFile
              ((PlyDecoder *)in_stack_fffffffffffffb38,(string *)in_stack_fffffffffffffb30,
               (Mesh *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    bVar1 = Status::ok(local_290);
    if (!bVar1) {
      StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
                ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
                 in_stack_fffffffffffffb30,
                 (Status *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    }
    local_21c = (uint)!bVar1;
    Status::~Status((Status *)0x1184e5);
    if (local_21c == 0) {
      StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
                ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
                 in_stack_fffffffffffffb30,
                 (unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
                 CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
      local_21c = 1;
    }
    PlyDecoder::~PlyDecoder((PlyDecoder *)0x118521);
    goto LAB_0011898a;
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffb30,
                          (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
  if (bVar1) {
    StlDecoder::DecodeFromFile(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
    local_21c = 1;
    goto LAB_0011898a;
  }
  this = &local_2b0;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x11859d);
  bVar1 = ReadFileToBuffer((string *)CONCAT17(in_stack_fffffffffffffb4f,in_stack_fffffffffffffb48),
                           (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffb40);
  if (bVar1) {
    DecoderBuffer::DecoderBuffer((DecoderBuffer *)in_stack_fffffffffffffb30);
    paVar2 = (allocator<char> *)
             std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x118700);
    std::vector<char,_std::allocator<char>_>::size
              ((vector<char,_std::allocator<char>_> *)&local_2b0);
    DecoderBuffer::Init((DecoderBuffer *)in_stack_fffffffffffffb30,
                        (char *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
                        0x118724);
    Decoder::Decoder((Decoder *)0x118738);
    Decoder::DecodeMeshFromBuffer(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    bVar1 = StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::ok
                      ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *
                       )0x118761);
    if (bVar1) {
      in_stack_fffffffffffffb40 =
           (Mesh *)StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::value
                             (local_3c8);
      bVar1 = std::operator==((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
                              in_stack_fffffffffffffb30,
                              (nullptr_t)
                              CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
      if (bVar1) goto LAB_0011879c;
      in_stack_fffffffffffffb30 =
           (ObjDecoder *)
           StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::value
                     (local_3c8);
      StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
                ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
                 in_stack_fffffffffffffb30,
                 (unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
                 CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    }
    else {
LAB_0011879c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this,in_stack_fffffffffffffb68,paVar2);
      Status::Status((Status *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,
                     (string *)0x1187e3);
      StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
                ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
                 in_stack_fffffffffffffb30,
                 (Status *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
      Status::~Status((Status *)0x118809);
      std::__cxx11::string::~string(local_410);
      std::allocator<char>::~allocator(&local_411);
    }
    local_21c = 1;
    StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::~StatusOr
              ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
               in_stack_fffffffffffffb30);
    Decoder::~Decoder((Decoder *)0x118934);
    DecoderBuffer::~DecoderBuffer((DecoderBuffer *)0x118941);
  }
  else {
    paVar2 = &local_2f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)paVar2,(allocator<char> *)in_stack_fffffffffffffb60);
    Status::Status((Status *)in_stack_fffffffffffffb30,in_stack_fffffffffffffb2c,(string *)0x11860a)
    ;
    StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
              ((StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
               in_stack_fffffffffffffb30,
               (Status *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28));
    Status::~Status((Status *)0x118630);
    std::__cxx11::string::~string(local_2f8);
    std::allocator<char>::~allocator(&local_2f9);
    local_21c = 1;
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffb40);
LAB_0011898a:
  std::__cxx11::string::~string(local_58);
  std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::~unique_ptr
            ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)in_stack_fffffffffffffb40
            );
  return in_RDI;
}

Assistant:

StatusOr<std::unique_ptr<Mesh>> ReadMeshFromFile(
    const std::string &file_name, const Options &options,
    std::vector<std::string> *mesh_files) {
  std::unique_ptr<Mesh> mesh(new Mesh());
  // Analyze file extension.
  const std::string extension = LowercaseFileExtension(file_name);
  if (extension != "gltf" && extension != "obj" && mesh_files) {
    // The GLTF/OBJ decoder will fill |mesh_files|, but for other file types we
    // set the root file here to avoid duplicating code.
    mesh_files->push_back(file_name);
  }
  if (extension == "obj") {
    // Wavefront OBJ file format.
    ObjDecoder obj_decoder;
    obj_decoder.set_use_metadata(options.GetBool("use_metadata", false));
    obj_decoder.set_preserve_polygons(options.GetBool("preserve_polygons"));
    const Status obj_status =
        obj_decoder.DecodeFromFile(file_name, mesh.get(), mesh_files);
    if (!obj_status.ok()) {
      return obj_status;
    }
    return std::move(mesh);
  }
  if (extension == "ply") {
    // Stanford PLY file format.
    PlyDecoder ply_decoder;
    DRACO_RETURN_IF_ERROR(ply_decoder.DecodeFromFile(file_name, mesh.get()));
    return std::move(mesh);
  }
  if (extension == "stl") {
    // STL file format.
    StlDecoder stl_decoder;
    return stl_decoder.DecodeFromFile(file_name);
  }
#ifdef DRACO_TRANSCODER_SUPPORTED
  if (extension == "gltf" || extension == "glb") {
    GltfDecoder gltf_decoder;
    return gltf_decoder.DecodeFromFile(file_name, mesh_files);
  }
#endif

  // Otherwise not an obj file. Assume the file was encoded with one of the
  // draco encoding methods.
  std::vector<char> file_data;
  if (!ReadFileToBuffer(file_name, &file_data)) {
    return Status(Status::DRACO_ERROR, "Unable to read input file.");
  }
  DecoderBuffer buffer;
  buffer.Init(file_data.data(), file_data.size());
  Decoder decoder;
  auto statusor = decoder.DecodeMeshFromBuffer(&buffer);
  if (!statusor.ok() || statusor.value() == nullptr) {
    return Status(Status::DRACO_ERROR, "Error decoding input.");
  }
  return std::move(statusor).value();
}